

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O3

void __thiscall
UnBanIRCCommand::trigger
          (UnBanIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  ulong uVar2;
  long *plVar3;
  undefined8 uVar4;
  char *pcVar5;
  
  if (parameters._M_len == 0) {
    pcVar5 = "Error: Too Few Parameters. Syntax: unban <Ban ID>";
    uVar4 = 0x31;
  }
  else {
    uVar2 = Jupiter_strtoull_s(parameters._M_str,parameters._M_len,0,channel._M_str);
    plVar3 = (long *)RenX::BanDatabase::getEntries();
    if (uVar2 < (ulong)(plVar3[1] - *plVar3 >> 3)) {
      cVar1 = RenX::BanDatabase::deactivate(RenX::banDatabase);
      if (cVar1 == '\0') {
        pcVar5 = "Error: Ban not active.";
        uVar4 = 0x16;
      }
      else {
        pcVar5 = "Ban deactivated.";
        uVar4 = 0x10;
      }
    }
    else {
      pcVar5 = "Error: Invalid ban ID; please find the ban ID using \"bansearch\".";
      uVar4 = 0x40;
    }
  }
  Jupiter::IRC::Client::sendNotice(source,nick._M_len,nick._M_str,uVar4,pcVar5);
  return;
}

Assistant:

void UnBanIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	if (!parameters.empty())
	{
		size_t index = Jupiter::from_string<size_t>(parameters);
		if (index < RenX::banDatabase->getEntries().size())
		{
			if (RenX::banDatabase->deactivate(index))
				source->sendNotice(nick, "Ban deactivated."sv);
			else
				source->sendNotice(nick, "Error: Ban not active."sv);
		}
		else
			source->sendNotice(nick, "Error: Invalid ban ID; please find the ban ID using \"bansearch\"."sv);
	}
	else source->sendNotice(nick, "Error: Too Few Parameters. Syntax: unban <Ban ID>"sv);
}